

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_tests.cpp
# Opt level: O3

void __thiscall
test::syntax_tests::iu_SyntaxTest_x_iutest_x_Double_Test::Body
          (iu_SyntaxTest_x_iutest_x_Double_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  AssertionResult iutest_ar;
  allocator<char> local_1f1;
  AssertionResult local_1f0;
  AssertionHelper local_1c8;
  undefined1 local_198 [392];
  
  iutest::internal::CmpHelperFloatingPointEQ<double>(&local_1f0,"1.0","d",1.0,1.0);
  if (local_1f0.m_result == false) {
    memset((iu_global_format_stringstream *)local_198,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_198);
    local_1c8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p =
         (pointer)0x3ff0000000000000;
    iutest::detail::iuStreamMessage::operator<<((iuStreamMessage *)local_198,(double *)&local_1c8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1c8,local_1f0.m_message._M_dataplus._M_p,&local_1f1);
    local_1c8.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/syntax_tests.cpp"
    ;
    local_1c8.m_part_result.super_iuCodeMessage.m_line = 0xef;
    local_1c8.m_part_result.super_iuCodeMessage._44_4_ = 2;
    iutest::AssertionHelper::OnFixed(&local_1c8,(Fixed *)local_198,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
        &local_1c8.m_part_result.super_iuCodeMessage.m_message.field_2) {
      operator_delete(local_1c8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                      local_1c8.m_part_result.super_iuCodeMessage.m_message.field_2.
                      _M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_198);
    std::ios_base::~ios_base((ios_base *)(local_198 + 0x80));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f0.m_message._M_dataplus._M_p == &local_1f0.m_message.field_2) {
      return;
    }
  }
  else {
    paVar1 = &local_1f0.m_message.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f0.m_message._M_dataplus._M_p != paVar1) {
      operator_delete(local_1f0.m_message._M_dataplus._M_p,
                      local_1f0.m_message.field_2._M_allocated_capacity + 1);
    }
    iutest::internal::CmpHelperFloatingPointEQ<double>(&local_1f0,"1.0","d",1.0,1.0);
    if (local_1f0.m_result == false) {
      memset((iu_global_format_stringstream *)local_198,0,0x188);
      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                ((iu_global_format_stringstream *)local_198);
      local_1c8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p =
           (pointer)0x3ff0000000000000;
      iutest::detail::iuStreamMessage::operator<<((iuStreamMessage *)local_198,(double *)&local_1c8)
      ;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1c8,local_1f0.m_message._M_dataplus._M_p,&local_1f1);
      local_1c8.m_part_result.super_iuCodeMessage.m_file =
           "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/syntax_tests.cpp"
      ;
      local_1c8.m_part_result.super_iuCodeMessage.m_line = 0xf1;
      local_1c8.m_part_result.super_iuCodeMessage._44_4_ = 1;
      iutest::AssertionHelper::OnFixed(&local_1c8,(Fixed *)local_198,false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
          &local_1c8.m_part_result.super_iuCodeMessage.m_message.field_2) {
        operator_delete(local_1c8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                        local_1c8.m_part_result.super_iuCodeMessage.m_message.field_2.
                        _M_allocated_capacity + 1);
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)local_198);
      std::ios_base::~ios_base((ios_base *)(local_198 + 0x80));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f0.m_message._M_dataplus._M_p != paVar1) {
      operator_delete(local_1f0.m_message._M_dataplus._M_p,
                      local_1f0.m_message.field_2._M_allocated_capacity + 1);
    }
    iutest::internal::CmpHelperFloatingPointEQ<double>(&local_1f0,"1.0","d",1.0,1.0);
    if (local_1f0.m_result == false) {
      memset((iu_global_format_stringstream *)local_198,0,0x188);
      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                ((iu_global_format_stringstream *)local_198);
      local_1c8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p =
           (pointer)0x3ff0000000000000;
      iutest::detail::iuStreamMessage::operator<<((iuStreamMessage *)local_198,(double *)&local_1c8)
      ;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1c8,local_1f0.m_message._M_dataplus._M_p,&local_1f1);
      local_1c8.m_part_result.super_iuCodeMessage.m_file =
           "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/syntax_tests.cpp"
      ;
      local_1c8.m_part_result.super_iuCodeMessage.m_line = 0xf3;
      local_1c8.m_part_result.super_iuCodeMessage._44_4_ = 0xffffffff;
      iutest::AssertionHelper::OnFixed(&local_1c8,(Fixed *)local_198,false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
          &local_1c8.m_part_result.super_iuCodeMessage.m_message.field_2) {
        operator_delete(local_1c8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                        local_1c8.m_part_result.super_iuCodeMessage.m_message.field_2.
                        _M_allocated_capacity + 1);
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)local_198);
      std::ios_base::~ios_base((ios_base *)(local_198 + 0x80));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f0.m_message._M_dataplus._M_p != paVar1) {
      operator_delete(local_1f0.m_message._M_dataplus._M_p,
                      local_1f0.m_message.field_2._M_allocated_capacity + 1);
    }
    iutest::internal::CmpHelperFloatingPointEQ<double>(&local_1f0,"1.0","d",1.0,1.0);
    if (local_1f0.m_result == false) {
      memset((iu_global_format_stringstream *)local_198,0,0x188);
      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                ((iu_global_format_stringstream *)local_198);
      local_1c8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p =
           (pointer)0x3ff0000000000000;
      iutest::detail::iuStreamMessage::operator<<((iuStreamMessage *)local_198,(double *)&local_1c8)
      ;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1c8,local_1f0.m_message._M_dataplus._M_p,&local_1f1);
      local_1c8.m_part_result.super_iuCodeMessage.m_file =
           "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/syntax_tests.cpp"
      ;
      local_1c8.m_part_result.super_iuCodeMessage.m_line = 0xf5;
      local_1c8.m_part_result.super_iuCodeMessage._44_4_ = 0xfffffffd;
      iutest::AssertionHelper::OnFixed(&local_1c8,(Fixed *)local_198,false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
          &local_1c8.m_part_result.super_iuCodeMessage.m_message.field_2) {
        operator_delete(local_1c8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                        local_1c8.m_part_result.super_iuCodeMessage.m_message.field_2.
                        _M_allocated_capacity + 1);
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)local_198);
      std::ios_base::~ios_base((ios_base *)(local_198 + 0x80));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f0.m_message._M_dataplus._M_p == paVar1) {
      return;
    }
  }
  operator_delete(local_1f0.m_message._M_dataplus._M_p,
                  local_1f0.m_message.field_2._M_allocated_capacity + 1);
  return;
}

Assistant:

IUTEST(SyntaxTest, Double)
{
    if( double d = 1.0 )
        IUTEST_ASSERT_DOUBLE_EQ(1.0, d) << d;
    if( double d = 1.0 )
        IUTEST_EXPECT_DOUBLE_EQ(1.0, d) << d;
    if( double d = 1.0 )
        IUTEST_INFORM_DOUBLE_EQ(1.0, d) << d;
    if( double d = 1.0 )
        IUTEST_ASSUME_DOUBLE_EQ(1.0, d) << d;
}